

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O3

void ppu_end_hblank(gba_ppu_t *ppu)

{
  bg_referencepoint_t *pbVar1;
  
  if ((dbg_window_visible) && (tick_on == SCANLINE)) {
    actual_dbg_tick();
  }
  pbVar1 = &(ppu->BG2X).current;
  pbVar1->raw = pbVar1->raw + (int)(ppu->BG2PB).sraw;
  pbVar1 = &(ppu->BG3X).current;
  pbVar1->raw = pbVar1->raw + (int)(ppu->BG3PB).sraw;
  pbVar1 = &(ppu->BG2Y).current;
  pbVar1->raw = pbVar1->raw + (int)(ppu->BG2PD).sraw;
  pbVar1 = &(ppu->BG3Y).current;
  pbVar1->raw = pbVar1->raw + (int)(ppu->BG3PD).sraw;
  *(byte *)&ppu->DISPSTAT = *(byte *)&ppu->DISPSTAT & 0xfd;
  ppu->y = ppu->y + 1;
  check_vcount(ppu);
  return;
}

Assistant:

void ppu_end_hblank(gba_ppu_t* ppu) {
    dbg_tick(SCANLINE);

    ppu->BG2X.current.sraw += ppu->BG2PB.sraw;
    ppu->BG3X.current.sraw += ppu->BG3PB.sraw;
    ppu->BG2Y.current.sraw += ppu->BG2PD.sraw;
    ppu->BG3Y.current.sraw += ppu->BG3PD.sraw;

    ppu->DISPSTAT.hblank = false;
    ppu->y++;

    check_vcount(ppu);
}